

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O0

void __thiscall QStyleOptionGroupBox::QStyleOptionGroupBox(QStyleOptionGroupBox *this)

{
  undefined8 in_RDI;
  
  QStyleOptionGroupBox(this,(int)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

QStyleOptionGroupBox::QStyleOptionGroupBox()
    : QStyleOptionGroupBox(Version)
{
}